

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tools.cpp
# Opt level: O1

MatrixXd * __thiscall
Tools::CalculateJacobian(MatrixXd *__return_storage_ptr__,Tools *this,VectorXd *x_state)

{
  double dVar1;
  double dVar2;
  long lVar3;
  double *pdVar4;
  CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *pCVar5;
  float fVar6;
  uint extraout_XMM0_Db;
  uint extraout_XMM0_Dc;
  uint extraout_XMM0_Dd;
  float fVar7;
  float __x;
  CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> local_c8;
  float local_a8;
  uint uStack_a4;
  uint uStack_a0;
  uint uStack_9c;
  double local_90;
  double local_88;
  Scalar local_80;
  Scalar local_78;
  Scalar local_70;
  Scalar local_68;
  Scalar local_60;
  Scalar local_58;
  Scalar local_50;
  Scalar local_48;
  Scalar local_40;
  Scalar local_38;
  Scalar local_30;
  float local_28;
  uint uStack_24;
  uint uStack_20;
  uint uStack_1c;
  
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
  m_storage.m_data = (double *)0x0;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
  m_storage.m_rows = 0;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
  m_storage.m_cols = 0;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
            ((DenseStorage<double,__1,__1,__1,_0> *)__return_storage_ptr__,0xc,3,4);
  local_c8.m_row = 0;
  local_c8.m_col = 1;
  local_c8.m_currentBlockRows = 1;
  *(__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
   m_storage.m_data = 0.0;
  local_30 = 0.0;
  local_c8.m_xpr = __return_storage_ptr__;
  pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (&local_c8,&local_30);
  local_38 = 0.0;
  pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar5,&local_38);
  local_40 = 0.0;
  pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar5,&local_40);
  local_48 = 0.0;
  pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar5,&local_48);
  local_50 = 0.0;
  pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar5,&local_50);
  local_58 = 0.0;
  pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar5,&local_58);
  local_60 = 0.0;
  pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar5,&local_60);
  local_68 = 0.0;
  pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar5,&local_68);
  local_70 = 0.0;
  pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar5,&local_70);
  local_78 = 0.0;
  pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar5,&local_78);
  local_80 = 0.0;
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_(pCVar5,&local_80);
  if (((local_c8.m_currentBlockRows + local_c8.m_row ==
        ((local_c8.m_xpr)->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
        m_storage.m_rows) ||
      (((local_c8.m_xpr)->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
       m_storage.m_cols == 0)) &&
     (local_c8.m_col ==
      ((local_c8.m_xpr)->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage
      .m_cols)) {
    lVar3 = (x_state->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
            m_rows;
    if (((lVar3 < 1) || (lVar3 == 1)) || ((lVar3 < 3 || (lVar3 == 3)))) {
      __assert_fail("index >= 0 && index < size()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/basavarajnavalgund[P]tracking-with-Extended-Kalman-Filter/src/Eigen/src/Core/DenseCoeffsBase.h"
                    ,0xad,
                    "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 0>::operator()(Index) const [Derived = Eigen::Matrix<double, -1, 1>, Level = 0]"
                   );
    }
    pdVar4 = (x_state->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
             m_data;
    fVar7 = (float)*pdVar4;
    local_a8 = (float)pdVar4[1];
    dVar1 = pdVar4[2];
    dVar2 = pdVar4[3];
    __x = fVar7 * fVar7 + local_a8 * local_a8;
    uStack_a4 = extraout_XMM0_Db;
    uStack_a0 = extraout_XMM0_Dc;
    uStack_9c = extraout_XMM0_Dd;
    if (__x < 0.0) {
      fVar6 = sqrtf(__x);
    }
    else {
      fVar6 = SQRT(__x);
    }
    if (0.0001 <= ABS(__x)) {
      local_88 = (double)(fVar7 / fVar6);
      local_c8.m_row = 0;
      local_c8.m_col = 1;
      local_c8.m_currentBlockRows = 1;
      *(__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
       m_storage.m_data = local_88;
      local_90 = (double)(local_a8 / fVar6);
      local_c8.m_xpr = __return_storage_ptr__;
      local_30 = local_90;
      pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                         (&local_c8,&local_30);
      local_38 = 0.0;
      pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                         (pCVar5,&local_38);
      local_40 = 0.0;
      pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                         (pCVar5,&local_40);
      local_28 = -local_a8;
      uStack_24 = uStack_a4 ^ 0x80000000;
      uStack_20 = uStack_a0 ^ 0x80000000;
      uStack_1c = uStack_9c ^ 0x80000000;
      local_48 = (Scalar)(local_28 / __x);
      pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                         (pCVar5,&local_48);
      local_50 = (Scalar)(fVar7 / __x);
      pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                         (pCVar5,&local_50);
      local_58 = 0.0;
      pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                         (pCVar5,&local_58);
      local_60 = 0.0;
      pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                         (pCVar5,&local_60);
      local_68 = (Scalar)((((float)dVar1 * local_a8 - (float)dVar2 * fVar7) * local_a8) /
                         (__x * fVar6));
      pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                         (pCVar5,&local_68);
      local_70 = (Scalar)((((float)dVar2 * fVar7 + local_28 * (float)dVar1) * fVar7) / (__x * fVar6)
                         );
      pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                         (pCVar5,&local_70);
      local_78 = local_88;
      pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                         (pCVar5,&local_78);
      local_80 = local_90;
      Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                (pCVar5,&local_80);
      if (((local_c8.m_currentBlockRows + local_c8.m_row !=
            ((local_c8.m_xpr)->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
            m_storage.m_rows) &&
          (((local_c8.m_xpr)->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
           m_storage.m_cols != 0)) ||
         (local_c8.m_col !=
          ((local_c8.m_xpr)->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
          m_storage.m_cols)) goto LAB_00110801;
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Function CalculateJacobian() has Error: Division by Zero",
                 0x38);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
      std::ostream::put('h');
      std::ostream::flush();
    }
    return __return_storage_ptr__;
  }
LAB_00110801:
  __assert_fail("((m_row+m_currentBlockRows) == m_xpr.rows() || m_xpr.cols() == 0) && m_col == m_xpr.cols() && \"Too few coefficients passed to comma initializer (operator<<)\""
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/basavarajnavalgund[P]tracking-with-Extended-Kalman-Filter/src/Eigen/src/Core/CommaInitializer.h"
                ,0x6f,
                "XprType &Eigen::CommaInitializer<Eigen::Matrix<double, -1, -1>>::finished() [MatrixType = Eigen::Matrix<double, -1, -1>]"
               );
}

Assistant:

MatrixXd Tools::CalculateJacobian(const VectorXd& x_state) {
  /**
    * Calculate a Jacobian here.
  */
  MatrixXd Hj(3,4);
  Hj << 0,0,0,0,
        0,0,0,0,
        0,0,0,0;

  //recover state parameters
  float px = x_state(0);
  float py = x_state(1);
  float vx = x_state(2);
  float vy = x_state(3);

  //pre-compute a set of terms to avoid repeated calculation
  float c1 = px*px+py*py;
  float c2 = sqrt(c1);
  float c3 = (c1*c2);

  //check division by zero
  if(fabs(c1) < 0.0001){
    std::cout << "Function CalculateJacobian() has Error: Division by Zero" << std::endl;
    return Hj;
  }

  //compute the Jacobian matrix
  Hj << (px/c2),                (py/c2),                0,      0,
        -(py/c1),               (px/c1),                0,      0, 
        py*(vx*py - vy*px)/c3,  px*(px*vy - py*vx)/c3,  px/c2,  py/c2;

  return Hj;

}